

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall cfd::core::BlindFactor::BlindFactor(BlindFactor *this,string *hex_string)

{
  CfdException *this_00;
  undefined1 local_80 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_28;
  
  this->_vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006493a0;
  ByteData256::ByteData256(&this->data_);
  reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)hex_string->_M_string_length;
  if (reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x40) {
    StringUtil::StringToByte
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
               (string *)hex_string);
    local_30.current._M_current =
         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            )local_80._0_8_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&reverse_buffer,&local_28,
               &local_30,(allocator_type *)&local_48);
    ByteData256::ByteData256((ByteData256 *)&local_48,&reverse_buffer);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data_,&local_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    return;
  }
  local_80._0_8_ = "cfdcore_elements_transaction.cpp";
  local_80._8_4_ = 0x2a7;
  local_80._16_8_ = "BlindFactor";
  logger::warn<unsigned_long>
            ((CfdSourceLocation *)local_80,"Value hex-string-length Invalid. length={}.",
             (unsigned_long *)&reverse_buffer);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_80,"Value hex string length Invalid.",(allocator *)&reverse_buffer);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

BlindFactor::BlindFactor(const std::string &hex_string) : data_() {
  if (hex_string.size() != (kByteData256Length * 2)) {
    warn(
        CFD_LOG_SOURCE, "Value hex-string-length Invalid. length={}.",
        hex_string.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Value hex string length Invalid.");
  }
  const std::vector<uint8_t> &data = StringUtil::StringToByte(hex_string);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  data_ = ByteData256(reverse_buffer);
}